

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatOrderH.c
# Opt level: O2

Msat_Order_t * Msat_OrderAlloc(Msat_Solver_t *pSat)

{
  Msat_Order_t *p;
  Msat_IntVec_t *pMVar1;
  
  p = (Msat_Order_t *)calloc(1,0x18);
  p->pSat = pSat;
  pMVar1 = Msat_IntVecAlloc(0);
  p->vIndex = pMVar1;
  pMVar1 = Msat_IntVecAlloc(0);
  p->vHeap = pMVar1;
  Msat_OrderSetBounds(p,pSat->nVarsAlloc);
  return p;
}

Assistant:

Msat_Order_t * Msat_OrderAlloc( Msat_Solver_t * pSat )
{
    Msat_Order_t * p;
    p = ABC_ALLOC( Msat_Order_t, 1 );
    memset( p, 0, sizeof(Msat_Order_t) );
    p->pSat   = pSat;
    p->vIndex = Msat_IntVecAlloc( 0 );
    p->vHeap  = Msat_IntVecAlloc( 0 );
    Msat_OrderSetBounds( p, pSat->nVarsAlloc );
    return p;
}